

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::startElement(XmlWriter *this,string *name)

{
  ostream *poVar1;
  XmlWriter *in_RSI;
  XmlWriter *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  XmlWriter *__x;
  
  __x = in_RDI;
  ensureTagClosed(in_RSI);
  newlineIfNecessary(in_RSI);
  poVar1 = stream(in_RDI);
  poVar1 = std::operator<<(poVar1,(string *)&in_RDI->m_indent);
  poVar1 = std::operator<<(poVar1,"<");
  std::operator<<(poVar1,(string *)in_RSI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(unaff_retaddr,(value_type *)__x);
  std::__cxx11::string::operator+=((string *)&in_RDI->m_indent,"  ");
  in_RDI->m_tagIsOpen = true;
  return in_RDI;
}

Assistant:

XmlWriter& startElement( std::string const& name ) {
            ensureTagClosed();
            newlineIfNecessary();
            stream() << m_indent << "<" << name;
            m_tags.push_back( name );
            m_indent += "  ";
            m_tagIsOpen = true;
            return *this;
        }